

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckEqualFailureIncludesDetails::~TestCheckEqualFailureIncludesDetails
          (TestCheckEqualFailureIncludesDetails *this)

{
  TestCheckEqualFailureIncludesDetails *this_local;
  
  ~TestCheckEqualFailureIncludesDetails(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckEqualFailureIncludesDetails)
{
    RecordingReporter reporter;
    TestResults results(&reporter);
    TestDetails const details("mytest", "mysuite", "file.h", 101);

    CheckEqual(results, 1, 2, details);

    CHECK_EQUAL("mytest", reporter.lastFailedTest);
    CHECK_EQUAL("mysuite", reporter.lastFailedSuite);
    CHECK_EQUAL("file.h", reporter.lastFailedFile);
    CHECK_EQUAL(101, reporter.lastFailedLine);
}